

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid_main.c
# Opt level: O2

void cpuid_grow_raw_data_array(cpu_raw_data_array_t *raw_array,logical_cpu_t n)

{
  cpu_raw_data_t *pcVar1;
  undefined4 *puVar2;
  ushort uVar3;
  undefined6 in_register_00000032;
  ulong uVar4;
  cpu_raw_data_t *__s;
  
  if ((int)CONCAT62(in_register_00000032,n) != 0) {
    uVar4 = CONCAT62(in_register_00000032,n) & 0xffffffff;
    uVar3 = (ushort)uVar4;
    if (raw_array->num_raw <= uVar3) {
      debugf(3,"Growing cpu_raw_data_array_t from %u to %u items\n",(ulong)raw_array->num_raw,uVar4)
      ;
      pcVar1 = (cpu_raw_data_t *)realloc(raw_array->raw,(ulong)n * 0x6b0);
      if (pcVar1 == (cpu_raw_data_t *)0x0) {
        puVar2 = (undefined4 *)__tls_get_addr(&PTR_00134f60);
        *puVar2 = 0xfffffffd;
      }
      else {
        uVar4 = (ulong)raw_array->num_raw;
        __s = pcVar1 + uVar4;
        for (; uVar4 < n; uVar4 = uVar4 + 1) {
          memset(__s,0,0x6b0);
          __s = __s + 1;
        }
        raw_array->num_raw = uVar3;
        raw_array->raw = pcVar1;
      }
    }
  }
  return;
}

Assistant:

static void cpuid_grow_raw_data_array(struct cpu_raw_data_array_t* raw_array, logical_cpu_t n)
{
	logical_cpu_t i;
	struct cpu_raw_data_t *tmp = NULL;

	if ((n <= 0) || (n < raw_array->num_raw)) return;
	debugf(3, "Growing cpu_raw_data_array_t from %u to %u items\n", raw_array->num_raw, n);
	tmp = realloc(raw_array->raw, sizeof(struct cpu_raw_data_t) * n);
	if (tmp == NULL) { /* Memory allocation failure */
		cpuid_set_error(ERR_NO_MEM);
		return;
	}

	for (i = raw_array->num_raw; i < n; i++)
		raw_data_t_constructor(&tmp[i]);
	raw_array->num_raw = n;
	raw_array->raw     = tmp;
}